

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void processDelayedCallbacks(UA_Server *server)

{
  UA_DelayedJob *pUVar1;
  UA_DelayedJob *pUVar2;
  UA_DelayedJob *pUVar3;
  UA_DelayedJob *__ptr;
  
  __ptr = (server->delayedCallbacks).slh_first;
  if (__ptr != (UA_DelayedJob *)0x0) {
    do {
      pUVar2 = (UA_DelayedJob *)&server->delayedCallbacks;
      for (pUVar3 = (server->delayedCallbacks).slh_first; pUVar3 != __ptr;
          pUVar3 = (pUVar3->next).sle_next) {
        pUVar2 = pUVar3;
      }
      pUVar1 = (__ptr->next).sle_next;
      (pUVar2->next).sle_next = (pUVar3->next).sle_next;
      processJob(server,&__ptr->job);
      free(__ptr);
      __ptr = pUVar1;
    } while (pUVar1 != (UA_DelayedJob *)0x0);
  }
  return;
}

Assistant:

static void
processDelayedCallbacks(UA_Server *server) {
    UA_DelayedJob *dj, *dj_tmp;
    SLIST_FOREACH_SAFE(dj, &server->delayedCallbacks, next, dj_tmp) {
        SLIST_REMOVE(&server->delayedCallbacks, dj, UA_DelayedJob, next);
        processJob(server, &dj->job);
        UA_free(dj);
    }
}